

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c++
# Opt level: O2

void __thiscall
kj::_::HeapArrayDisposer::disposeImpl
          (HeapArrayDisposer *this,void *firstElement,size_t elementSize,size_t elementCount,
          size_t capacity,_func_void_void_ptr *destroyElement)

{
  ExceptionSafeArrayUtil guard;
  ExceptionSafeArrayUtil local_30;
  
  if (destroyElement != (_func_void_void_ptr *)0x0) {
    local_30.pos = (byte *)(elementCount * elementSize + (long)firstElement);
    local_30.elementSize = elementSize;
    local_30.constructedElementCount = elementCount;
    local_30.destroyElement = destroyElement;
    ExceptionSafeArrayUtil::destroyAll(&local_30);
    ExceptionSafeArrayUtil::~ExceptionSafeArrayUtil(&local_30);
  }
  operator_delete(firstElement);
  return;
}

Assistant:

void HeapArrayDisposer::disposeImpl(
    void* firstElement, size_t elementSize, size_t elementCount, size_t capacity,
    void (*destroyElement)(void*)) const {
  // Note that capacity is ignored since operator delete() doesn't care about it.
  AutoDeleter deleter(firstElement);

  if (destroyElement != nullptr) {
    ExceptionSafeArrayUtil guard(firstElement, elementSize, elementCount, destroyElement);
    guard.destroyAll();
  }
}